

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode DecodeVP8FrameHeader(WebPIDecoder *idec)

{
  int iVar1;
  uint3 *chunk_size;
  int *width_00;
  undefined4 *in_RDI;
  uint32_t bits;
  int height;
  int width;
  size_t curr_size;
  uint8_t *data;
  VP8StatusCode in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  VP8StatusCode VVar2;
  
  chunk_size = (uint3 *)(*(long *)(in_RDI + 0x52) + *(long *)(in_RDI + 0x4c));
  width_00 = (int *)MemDataSize((MemBuffer_conflict *)(in_RDI + 0x4a));
  if (width_00 < (int *)0xa) {
    VVar2 = VP8_STATUS_SUSPENDED;
  }
  else {
    iVar1 = VP8GetInfo((uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (size_t)in_RDI,(size_t)chunk_size,width_00,in_stack_ffffffffffffffd8);
    if (iVar1 == 0) {
      VVar2 = IDecError((WebPIDecoder *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    }
    else {
      *(ulong *)(in_RDI + 0x54) = (ulong)((*chunk_size >> 5) + 10);
      *(uint3 **)(in_RDI + 0x3c) = chunk_size;
      *(int **)(in_RDI + 0x3a) = width_00;
      *in_RDI = 2;
      VVar2 = VP8_STATUS_OK;
    }
  }
  return VVar2;
}

Assistant:

static VP8StatusCode DecodeVP8FrameHeader(WebPIDecoder* const idec) {
  const uint8_t* data = idec->mem_.buf_ + idec->mem_.start_;
  const size_t curr_size = MemDataSize(&idec->mem_);
  int width, height;
  uint32_t bits;

  if (curr_size < VP8_FRAME_HEADER_SIZE) {
    // Not enough data bytes to extract VP8 Frame Header.
    return VP8_STATUS_SUSPENDED;
  }
  if (!VP8GetInfo(data, curr_size, idec->chunk_size_, &width, &height)) {
    return IDecError(idec, VP8_STATUS_BITSTREAM_ERROR);
  }

  bits = data[0] | (data[1] << 8) | (data[2] << 16);
  idec->mem_.part0_size_ = (bits >> 5) + VP8_FRAME_HEADER_SIZE;

  idec->io_.data = data;
  idec->io_.data_size = curr_size;
  idec->state_ = STATE_VP8_PARTS0;
  return VP8_STATUS_OK;
}